

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_bool32 ma_dr_wav__on_seek_memory_write(void *pUserData,int offset,ma_dr_wav_seek_origin origin)

{
  ulong uVar1;
  
  if (origin == ma_dr_wav_seek_origin_current) {
    uVar1 = *(ulong *)((long)pUserData + 0xf8);
    if (offset < 1) {
      if (uVar1 < (uint)-offset) {
        offset = -(int)uVar1;
      }
    }
    else if (*(ulong *)((long)pUserData + 0xe8) < (uint)offset + uVar1) {
      offset = (int)*(ulong *)((long)pUserData + 0xe8) - (int)uVar1;
    }
    uVar1 = uVar1 + (long)offset;
  }
  else {
    uVar1 = *(ulong *)((long)pUserData + 0xe8);
    if ((uint)offset <= uVar1) {
      uVar1 = (ulong)offset;
    }
  }
  *(ulong *)((long)pUserData + 0xf8) = uVar1;
  return 1;
}

Assistant:

MA_PRIVATE ma_bool32 ma_dr_wav__on_seek_memory_write(void* pUserData, int offset, ma_dr_wav_seek_origin origin)
{
    ma_dr_wav* pWav = (ma_dr_wav*)pUserData;
    MA_DR_WAV_ASSERT(pWav != NULL);
    if (origin == ma_dr_wav_seek_origin_current) {
        if (offset > 0) {
            if (pWav->memoryStreamWrite.currentWritePos + offset > pWav->memoryStreamWrite.dataSize) {
                offset = (int)(pWav->memoryStreamWrite.dataSize - pWav->memoryStreamWrite.currentWritePos);
            }
        } else {
            if (pWav->memoryStreamWrite.currentWritePos < (size_t)-offset) {
                offset = -(int)pWav->memoryStreamWrite.currentWritePos;
            }
        }
        pWav->memoryStreamWrite.currentWritePos += offset;
    } else {
        if ((ma_uint32)offset <= pWav->memoryStreamWrite.dataSize) {
            pWav->memoryStreamWrite.currentWritePos = offset;
        } else {
            pWav->memoryStreamWrite.currentWritePos = pWav->memoryStreamWrite.dataSize;
        }
    }
    return MA_TRUE;
}